

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_lockfree_queue.cpp
# Opt level: O0

void consumer(void)

{
  bool bVar1;
  int local_c [2];
  int value;
  
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&done), ((bVar1 ^ 0xffU) & 1) != 0) {
    while (bVar1 = boost::lockfree::queue<int>::pop(&queue,local_c), bVar1) {
      std::operator<<((ostream *)&std::cout,".");
      std::__atomic_base<int>::operator++(&consumer_count.super___atomic_base<int>);
    }
  }
  while (bVar1 = boost::lockfree::queue<int>::pop(&queue,local_c), bVar1) {
    std::__atomic_base<int>::operator++(&consumer_count.super___atomic_base<int>);
  }
  return;
}

Assistant:

void consumer(void)
{
	int value;

	while (!done) {
		while (queue.pop(value)) {
			cout << ".";
			++consumer_count;
		}
	}

	while (queue.pop(value))
		++consumer_count;
}